

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseLine
          (MultipoleAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  double *pdVar4;
  SquareMatrix3<double> *this_00;
  SquareMatrix3<double> *m2;
  uint in_ECX;
  undefined8 in_RDX;
  RealType RVar5;
  bool isQuadrupole;
  bool isDipole;
  Mat3x3d quadrupole;
  Vector3d quadrupoleMoments;
  Vector3d dipole;
  RealType dipoleMoment;
  RotMat3x3d eFrame;
  MultipoleAdapter ma;
  AtomType *atomType;
  RealType psi;
  RealType theta;
  RealType phi;
  string multipoleType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  StringTokenizer *in_stack_fffffffffffffb70;
  StringTokenizer *in_stack_fffffffffffffb78;
  StringTokenizer *in_stack_fffffffffffffb80;
  StringTokenizer *in_stack_fffffffffffffb88;
  double dVar6;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb90;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  ForceField *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffc18;
  undefined2 uVar7;
  Mat3x3d *quadrupole_00;
  Vector3d *in_stack_fffffffffffffc38;
  MultipoleAdapter *in_stack_fffffffffffffc40;
  RectMatrix<double,_3U,_3U> local_248;
  byte local_1e2;
  byte local_1e1;
  RectMatrix<double,_3U,_3U> local_1e0;
  Vector<double,_3U> local_198 [2];
  undefined8 local_168;
  MultipoleAdapter local_118;
  AtomType *local_110;
  double local_108;
  double local_100;
  double local_f8;
  string local_f0 [32];
  string local_d0 [32];
  int local_b0;
  undefined1 local_99 [125];
  uint local_1c;
  
  uVar7 = (undefined2)((ulong)in_RDX >> 0x30);
  quadrupole_00 = (Mat3x3d *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,
             (allocator<char> *)in_stack_fffffffffffffba0);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             in_stack_fffffffffffffba0);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  iVar2 = StringTokenizer::countTokens(in_stack_fffffffffffffb80);
  local_b0 = iVar2;
  if (iVar2 < 5) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)local_1c
            );
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_
              ((StringTokenizer *)CONCAT44(iVar2,in_stack_fffffffffffffc18));
    StringTokenizer::nextToken_abi_cxx11_
              ((StringTokenizer *)CONCAT44(iVar2,in_stack_fffffffffffffc18));
    RVar5 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffbb0);
    local_f8 = (RVar5 * 3.141592653589793) / 180.0;
    RVar5 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffbb0);
    local_100 = (RVar5 * 3.141592653589793) / 180.0;
    RVar5 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffbb0);
    local_108 = (RVar5 * 3.141592653589793) / 180.0;
    local_110 = ForceField::getAtomType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (local_110 == (AtomType *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "MultipoleAtomTypesSectionParser Error: Can not find matched AtomType[%s] at line %d\n"
               ,uVar3,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    MultipoleAdapter::MultipoleAdapter(&local_118,local_110);
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb70,
               (double)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    SquareMatrix3<double>::setupRotMat
              ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,(double)in_stack_fffffffffffffba8,
               (double)in_stack_fffffffffffffba0,(double)in_stack_fffffffffffffb98);
    local_168 = 0;
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb70,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb70,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb70,
               (double)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    local_1e1 = 0;
    local_1e2 = 0;
    bVar1 = std::operator==(&in_stack_fffffffffffffb70->tokenString_,
                            (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    if (bVar1) {
      parseDipole((MultipoleAtomTypesSectionParser *)in_stack_fffffffffffffb80,
                  in_stack_fffffffffffffb78,(RealType *)in_stack_fffffffffffffb70,
                  in_stack_fffffffffffffb6c);
      local_1e1 = 1;
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffb70->tokenString_,
                              (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
      ;
      if (bVar1) {
        snprintf(painCave.errMsg,2000,
                 "MultipoleAtomTypesSectionParser Error: \n\tsplit dipoles (type s) have been deprecated (line: %d)\n"
                 ,(ulong)local_1c);
        painCave.isFatal = 1;
        simError();
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffb70->tokenString_,
                                (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68
                                                ));
        if (bVar1) {
          parseQuadrupole((MultipoleAtomTypesSectionParser *)in_stack_fffffffffffffb90,
                          in_stack_fffffffffffffb88,(Vector3d *)in_stack_fffffffffffffb80,
                          (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          local_1e2 = 1;
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffffb70->tokenString_,
                                  (char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                   in_stack_fffffffffffffb68));
          if (bVar1) {
            parseDipole((MultipoleAtomTypesSectionParser *)in_stack_fffffffffffffb80,
                        in_stack_fffffffffffffb78,(RealType *)in_stack_fffffffffffffb70,
                        in_stack_fffffffffffffb6c);
            local_1e1 = 1;
            parseQuadrupole((MultipoleAtomTypesSectionParser *)in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb88,(Vector3d *)in_stack_fffffffffffffb80,
                            (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
            local_1e2 = 1;
          }
          else {
            bVar1 = std::operator==(&in_stack_fffffffffffffb70->tokenString_,
                                    (char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                     in_stack_fffffffffffffb68));
            if (bVar1) {
              snprintf(painCave.errMsg,2000,
                       "MultipoleAtomTypesSectionParser Error: \n\tsplit dipole quadrupoles (type sq) have been deprecated (line: %d)\n"
                       ,(ulong)local_1c);
              painCave.isFatal = 1;
              simError();
            }
            else {
              snprintf(painCave.errMsg,2000,
                       "MultipoleAtomTypesSectionParser Error: unrecognized multiple type at line %d\n"
                       ,(ulong)local_1c);
              painCave.isFatal = 1;
              simError();
            }
          }
        }
      }
    }
    if ((local_1e1 & 1) != 0) {
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffffb98);
      OpenMD::operator*((double)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      OpenMD::operator*(in_stack_fffffffffffffb98,(Vector<double,_3U> *)in_stack_fffffffffffffb90);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffb78,
                 (Vector<double,_3U> *)in_stack_fffffffffffffb70);
      RectMatrix<double,_3U,_3U>::~RectMatrix(&local_248);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0a35);
    }
    if ((local_1e2 & 1) != 0) {
      pdVar4 = Vector<double,_3U>::operator()(local_198,0);
      dVar6 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_1e0,0,0);
      *pdVar4 = dVar6;
      this_00 = (SquareMatrix3<double> *)Vector<double,_3U>::operator()(local_198,1);
      dVar6 = (this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
      m2 = (SquareMatrix3<double> *)RectMatrix<double,_3U,_3U>::operator()(&local_1e0,1,1);
      (m2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = dVar6;
      pdVar4 = Vector<double,_3U>::operator()(local_198,2);
      in_stack_fffffffffffffb70 = (StringTokenizer *)*pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_1e0,2,2);
      *pdVar4 = (double)in_stack_fffffffffffffb70;
      SquareMatrix3<double>::transpose(this_00);
      OpenMD::operator*(this_00,m2);
      OpenMD::operator*(this_00,m2);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffb70,
                 (SquareMatrix3<double> *)
                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0bf7);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0c04);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0c11);
    }
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb70,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb70,
               (SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    MultipoleAdapter::makeMultipole
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,quadrupole_00,
               SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0cf1);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0cfe);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2c0d0b);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffb70);
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseLine(ForceField& ff,
                                                  const std::string& line,
                                                  int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // name multipole_type theta phi psi
    // "name" must match the name in the AtomTypes section
    //
    // avaliable multipole types are:
    // d  (dipole)
    // q  (quadrupole)
    // dq (dipole plus quadrupole)
    //
    // Directionality for dipoles and quadrupoles is given by three
    // euler angles (phi, theta, psi), because the body-fixed
    // reference frame for directional atoms is determined by the
    // *mass* distribution and not by the charge distribution.
    //
    // Dipoles are given in units of Debye
    // Quadrupoles are given in units of esu centibarn
    //
    // Examples:
    //
    // name d phi theta psi dipole_moment
    // name q phi theta psi Qxx Qyy Qzz
    // name dq phi theta psi dipole_moment Qxx Qyy Qzz

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName  = tokenizer.nextToken();
      std::string multipoleType = tokenizer.nextToken();
      RealType phi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType theta = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType psi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: Can not find matched "
                 "AtomType[%s] "
                 "at line %d\n",
                 atomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      MultipoleAdapter ma = MultipoleAdapter(atomType);

      RotMat3x3d eFrame(0.0);

      eFrame.setupRotMat(phi, theta, psi);

      RealType dipoleMoment(0);
      Vector3d dipole(V3Zero);
      Vector3d quadrupoleMoments(V3Zero);
      Mat3x3d quadrupole(0.0);

      bool isDipole(false);
      bool isQuadrupole(false);

      if (multipoleType == "d") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
      } else if (multipoleType == "s") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipoles (type s) have been deprecated (line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else if (multipoleType == "q") {
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "dq") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "sq") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipole quadrupoles (type sq) have been deprecated "
                 "(line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: unrecognized multiple "
                 "type at line "
                 "%d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
      if (isDipole) dipole = dipoleMoment * eFrame.transpose() * V3Z;
      if (isQuadrupole) {
        quadrupole(0, 0) = quadrupoleMoments(0);
        quadrupole(1, 1) = quadrupoleMoments(1);
        quadrupole(2, 2) = quadrupoleMoments(2);
        quadrupole       = eFrame.transpose() * quadrupole * eFrame;
      }

      ma.makeMultipole(dipole, quadrupole, isDipole, isQuadrupole);
    }
  }